

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd,int MaxSubscriptions)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  Handle_Info **HndInfo;
  char *file;
  Handle_Info *SInfo;
  Handle_Info *local_20;
  
  local_20 = (Handle_Info *)0x0;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x845,"Inside UpnpSetMaxSubscriptions \n");
    HandleLock((char *)0x848,iVar2);
    HndInfo = &local_20;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    if (UVar1 == HND_DEVICE) {
      if (-2 < MaxSubscriptions) {
        local_20->MaxSubscriptions = MaxSubscriptions;
        HandleUnlock((char *)0x855,(int)HndInfo);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x85a,"Exiting UpnpSetMaxSubscriptions \n"
                  );
        return 0;
      }
      file = (char *)0x851;
    }
    else {
      file = (char *)0x84d;
    }
    HandleUnlock(file,(int)HndInfo);
    iVar2 = -100;
  }
  return iVar2;
}

Assistant:

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd, int MaxSubscriptions)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptions \n");

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptions != UPNP_INFINITE) && (MaxSubscriptions < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	SInfo->MaxSubscriptions = MaxSubscriptions;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptions \n");

	return UPNP_E_SUCCESS;
}